

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_ssse3.c
# Opt level: O2

void calculate_dqcoeff_and_store_64x64
               (__m128i qcoeff,__m128i dequant,__m128i zero,tran_low_t *dqcoeff)

{
  undefined1 auVar1 [12];
  unkbyte10 Var2;
  undefined1 auVar3 [12];
  uint uVar4;
  uint uVar5;
  short sVar9;
  undefined1 in_XMM0 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM1 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  
  auVar10 = pabsw(in_XMM2,in_XMM0);
  auVar3._10_2_ = in_XMM0._4_2_;
  auVar3._0_10_ = (unkuint10)0;
  auVar8._2_12_ = SUB1612(ZEXT616(CONCAT42(auVar3._8_4_,in_XMM0._2_2_)) << 0x30,4);
  auVar8._0_2_ = in_XMM0._0_2_;
  auVar8._14_2_ = 0;
  auVar12._0_10_ = (unkuint10)CONCAT24(in_XMM0._10_2_,(uint)in_XMM0._8_2_) << 0x10;
  auVar12._10_2_ = in_XMM0._12_2_;
  auVar12._12_2_ = 0;
  auVar12._14_2_ = in_XMM0._14_2_;
  sVar9 = auVar10._6_2_ * in_XMM1._6_2_;
  auVar11 = pmulhw(auVar10,in_XMM1);
  uVar4 = CONCAT22(auVar11._6_2_,sVar9);
  Var2 = CONCAT64(CONCAT42(uVar4,auVar11._4_2_),CONCAT22(auVar10._4_2_ * in_XMM1._4_2_,sVar9));
  auVar1._4_8_ = (long)((unkuint10)Var2 >> 0x10);
  auVar1._2_2_ = auVar11._2_2_;
  auVar1._0_2_ = auVar10._2_2_ * in_XMM1._2_2_;
  uVar5 = CONCAT22(auVar11._8_2_,auVar10._8_2_ * in_XMM1._8_2_);
  auVar6._0_8_ = CONCAT26(auVar11._10_2_,CONCAT24(auVar10._10_2_ * in_XMM1._10_2_,uVar5));
  auVar6._8_2_ = auVar10._12_2_ * in_XMM1._12_2_;
  auVar6._10_2_ = auVar11._12_2_;
  auVar7._12_2_ = auVar10._14_2_ * in_XMM1._14_2_;
  auVar7._0_12_ = auVar6;
  auVar7._14_2_ = auVar11._14_2_;
  auVar11._0_4_ = CONCAT22(auVar11._0_2_,auVar10._0_2_ * in_XMM1._0_2_) >> 2;
  auVar11._4_4_ = auVar1._0_4_ >> 2;
  auVar11._8_4_ = (uint)((unkuint10)Var2 >> 0x10) >> 2;
  auVar11._12_4_ = uVar4 >> 2;
  auVar11 = psignd(auVar11,auVar8 << 0x10);
  auVar10._0_4_ = uVar5 >> 2;
  auVar10._4_4_ = (uint)((ulong)auVar6._0_8_ >> 0x22);
  auVar10._8_4_ = auVar6._8_4_ >> 2;
  auVar10._12_4_ = auVar7._12_4_ >> 2;
  auVar8 = psignd(auVar10,auVar12);
  *(undefined1 (*) [16])qcoeff[0] = auVar11;
  *(undefined1 (*) [16])(qcoeff[0] + 0x10) = auVar8;
  return;
}

Assistant:

static inline void calculate_dqcoeff_and_store_64x64(const __m128i qcoeff,
                                                     const __m128i dequant,
                                                     const __m128i zero,
                                                     tran_low_t *dqcoeff) {
  // Un-sign to bias rounding like C.
  const __m128i coeff = _mm_abs_epi16(qcoeff);

  const __m128i sign_0 = _mm_unpacklo_epi16(zero, qcoeff);
  const __m128i sign_1 = _mm_unpackhi_epi16(zero, qcoeff);

  const __m128i low = _mm_mullo_epi16(coeff, dequant);
  const __m128i high = _mm_mulhi_epi16(coeff, dequant);
  __m128i dqcoeff32_0 = _mm_unpacklo_epi16(low, high);
  __m128i dqcoeff32_1 = _mm_unpackhi_epi16(low, high);

  // "Divide" by 4.
  dqcoeff32_0 = _mm_srli_epi32(dqcoeff32_0, 2);
  dqcoeff32_1 = _mm_srli_epi32(dqcoeff32_1, 2);

  dqcoeff32_0 = _mm_sign_epi32(dqcoeff32_0, sign_0);
  dqcoeff32_1 = _mm_sign_epi32(dqcoeff32_1, sign_1);

  _mm_store_si128((__m128i *)(dqcoeff), dqcoeff32_0);
  _mm_store_si128((__m128i *)(dqcoeff + 4), dqcoeff32_1);
}